

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createPipeline
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ProgramParams *pp)

{
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *inputs;
  VaryingInterface *varyings;
  ostringstream *poVar1;
  RenderContext *renderCtx;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_00;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_01;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_02;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  data_03;
  ProgramWrapper *pPVar2;
  bool condition;
  bool bVar3;
  deUint32 dVar4;
  deUint32 seed;
  ProgramPipeline *pPVar5;
  Pipeline *pPVar6;
  ProgramWrapper *pPVar7;
  char *pcVar8;
  ProgramWrapper *pPVar9;
  ProgramWrapper *pPStack_2c8;
  MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> pipeline;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  frgProg;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  vtxProg;
  string vtxSource;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  fullProg;
  string vtxName;
  string frgName;
  string frgSource;
  undefined1 local_1f0 [384];
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_70;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_60;
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  local_50;
  UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> local_40;
  
  bVar3 = (this->m_params).useUniform;
  pcVar8 = "vtxScale";
  if ((this->m_params).useSameName != false) {
    pcVar8 = "scale";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtxName,pcVar8,(allocator<char> *)local_1f0);
  if ((this->m_params).switchVtx == true) {
    dVar4 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  }
  else {
    dVar4 = pp->vtxSeed;
  }
  pcVar8 = "frgScale";
  if ((this->m_params).useSameName != false) {
    pcVar8 = "scale";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&frgName,pcVar8,(allocator<char> *)local_1f0);
  if ((this->m_params).switchFrg == true) {
    seed = deRandom_getUint32(&(this->m_rnd).m_rnd);
  }
  else {
    seed = pp->frgSeed;
  }
  inputs = &(this->m_varyings).frgInputs;
  genFrgShaderSrc(&frgSource,seed,inputs,&frgName,bVar3,pp->frgScale);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  pPVar5 = (ProgramPipeline *)operator_new(0x10);
  glu::ProgramPipeline::ProgramPipeline(pPVar5,renderCtx);
  fullProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  vtxProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  frgProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  varyings = &this->m_varyings;
  pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.m_data.
  ptr = pPVar5;
  if ((this->m_params).initSingle == true) {
    varyingCompatVtxOutputs
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               local_1f0,varyings);
    genVtxShaderSrc(&vtxSource,dVar4,
                    (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
                    local_1f0,&vtxName,bVar3,pp->vtxScale);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               local_1f0);
    createShaderProgram((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_1f0,this,&vtxSource,&frgSource,true);
    local_1f0._0_8_ = (pointer)0x0;
    data._8_8_ = pipeline.
                 super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
                 m_data.ptr;
    data.ptr = pPStack_2c8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=(&fullProg,data);
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~UniqueBase((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                   *)local_1f0);
    pPVar5 = pipeline.
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr;
    dVar4 = (*(fullProg.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data.ptr)->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar5,3,dVar4);
    local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Created pipeline ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," with two-shader program ");
    (*(fullProg.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
       .m_data.ptr)->_vptr_ProgramWrapper[2])();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    genVtxShaderSrc(&vtxSource,dVar4,&varyings->vtxOutputs,&vtxName,bVar3,pp->vtxScale);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1f0,this,SHADERTYPE_VERTEX,&vtxSource);
    local_1f0._0_8_ = (pointer)0x0;
    data_00._8_8_ =
         pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
         m_data.ptr;
    data_00.ptr = pPStack_2c8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=(&vtxProg,data_00);
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~UniqueBase((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                   *)local_1f0);
    pPVar5 = pipeline.
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr;
    dVar4 = (*(vtxProg.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data.ptr)->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar5,1,dVar4);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1f0,this,SHADERTYPE_FRAGMENT,&frgSource);
    local_1f0._0_8_ = (pointer)0x0;
    data_01._8_8_ =
         pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
         m_data.ptr;
    data_01.ptr = pPStack_2c8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=(&frgProg,data_01);
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~UniqueBase((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                   *)local_1f0);
    pPVar5 = pipeline.
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr;
    dVar4 = (*(frgProg.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data.ptr)->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar5,2,dVar4);
    local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Created pipeline ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," with vertex program ");
    (*(vtxProg.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
       .m_data.ptr)->_vptr_ProgramWrapper[2])();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," and fragment program ");
    (*(frgProg.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
       .m_data.ptr)->_vptr_ProgramWrapper[2])();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&vtxSource);
  condition = glu::ProgramPipeline::isValid
                        (pipeline.
                         super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                         .m_data.ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,"Pipeline is invalid after initialization",
             (allocator<char> *)&vtxSource);
  tcu::ResultCollector::check(&this->m_status,condition,(string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  if ((this->m_params).switchVtx == true) {
    genVtxShaderSrc(&vtxSource,pp->vtxSeed,&varyings->vtxOutputs,&vtxName,bVar3,pp->vtxScale);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1f0,this,SHADERTYPE_VERTEX,&vtxSource);
    local_1f0._0_8_ = (pointer)0x0;
    data_02._8_8_ =
         pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
         m_data.ptr;
    data_02.ptr = pPStack_2c8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=(&vtxProg,data_02);
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~UniqueBase((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                   *)local_1f0);
    pPVar5 = pipeline.
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr;
    dVar4 = (*(vtxProg.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data.ptr)->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar5,1,dVar4);
    local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Switched pipeline ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,"\'s vertex stage to single-shader program ");
    (*(vtxProg.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
       .m_data.ptr)->_vptr_ProgramWrapper[2])();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::~string((string *)&vtxSource);
  }
  if ((this->m_params).switchFrg == true) {
    genFrgShaderSrc(&vtxSource,pp->frgSeed,inputs,&frgName,bVar3,pp->frgScale);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1f0,this,SHADERTYPE_FRAGMENT,&vtxSource);
    local_1f0._0_8_ = (pointer)0x0;
    data_03._8_8_ =
         pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
         m_data.ptr;
    data_03.ptr = pPStack_2c8;
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::operator=(&frgProg,data_03);
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ::~UniqueBase((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                   *)local_1f0);
    pPVar5 = pipeline.
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr;
    dVar4 = (*(frgProg.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data.ptr)->_vptr_ProgramWrapper[2])();
    glu::ProgramPipeline::useProgramStages(pPVar5,2,dVar4);
    local_1f0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1f0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Switched pipeline ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,"\'s fragment stage to single-shader program ");
    (*(frgProg.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
       .m_data.ptr)->_vptr_ProgramWrapper[2])();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::__cxx11::string::~string((string *)&vtxSource);
  }
  if (((this->m_params).switchVtx != false) || ((this->m_params).switchFrg == true)) {
    bVar3 = glu::ProgramPipeline::isValid
                      (pipeline.
                       super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                       .m_data.ptr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,"Pipeline became invalid after changing a stage\'s program",
               (allocator<char> *)&vtxSource);
    tcu::ResultCollector::check(&this->m_status,bVar3,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  pPVar7 = fullProg.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  pPVar2 = frgProg.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if ((this->m_params).useUniform == true) {
    pPVar9 = vtxProg.
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
    if (vtxProg.
        super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
        .m_data.ptr == (ProgramWrapper *)0x0) {
      pPVar9 = fullProg.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               .m_data.ptr;
    }
    setUniform(this,pPVar9,&vtxName,pp->vtxScale,(this->m_params).useProgramUniform);
    if (pPVar2 != (ProgramWrapper *)0x0) {
      pPVar7 = pPVar2;
    }
    setUniform(this,pPVar7,&frgName,pp->frgScale,(this->m_params).useProgramUniform);
  }
  else {
    tcu::TestLog::writeMessage
              (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
               "// Programs use constants instead of uniforms");
  }
  pPVar6 = (Pipeline *)operator_new(0x40);
  pPVar9 = fullProg.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  pPVar7 = vtxProg.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  pPVar2 = frgProg.
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  pPVar5 = pipeline.
           super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.m_data.
           ptr;
  pipeline.super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.m_data.
  ptr = (ProgramPipeline *)0x0;
  fullProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  vtxProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  frgProg.
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)0x0;
  local_40.m_data.ptr = (ProgramPipeline *)0x0;
  (pPVar6->pipeline).
  super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.m_data.ptr =
       pPVar5;
  local_50.m_data.ptr = (ProgramWrapper *)0x0;
  local_60.m_data.ptr = (ProgramWrapper *)0x0;
  local_70.m_data.ptr = (ProgramWrapper *)0x0;
  (pPVar6->fullProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = pPVar9;
  (pPVar6->vtxProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = pPVar7;
  (pPVar6->frgProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = pPVar2;
  (__return_storage_ptr__->
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ).m_data.ptr = pPVar6;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&local_70);
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&local_60);
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&local_50);
  de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::
  ~UniqueBase(&local_40);
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&frgProg.
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               );
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&vtxProg.
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               );
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::~UniqueBase(&fullProg.
                 super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
               );
  de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::
  ~UniqueBase(&pipeline.
               super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>);
  std::__cxx11::string::~string((string *)&frgSource);
  std::__cxx11::string::~string((string *)&frgName);
  std::__cxx11::string::~string((string *)&vtxName);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Pipeline> SeparateShaderTest::createPipeline (const ProgramParams& pp)
{
	const bool		useUniform	= m_params.useUniform;
	const string	vtxName		= m_params.useSameName ? "scale" : "vtxScale";
	const deUint32	initVtxSeed	= m_params.switchVtx ? m_rnd.getUint32() : pp.vtxSeed;

	const string	frgName		= m_params.useSameName ? "scale" : "frgScale";
	const deUint32	initFrgSeed	= m_params.switchFrg ? m_rnd.getUint32() : pp.frgSeed;
	const string	frgSource	= genFrgShaderSrc(initFrgSeed, m_varyings.frgInputs,
												  frgName, useUniform, pp.frgScale);

	const RenderContext&		renderCtx	= getRenderContext();
	MovePtr<ProgramPipeline>	pipeline	(new ProgramPipeline(renderCtx));
	MovePtr<ProgramWrapper>		fullProg;
	MovePtr<ProgramWrapper>		vtxProg;
	MovePtr<ProgramWrapper>		frgProg;

	// We cannot allow a situation where we have a single program with a
	// single uniform, because then the vertex and fragment shader uniforms
	// would not be distinct in the final pipeline, and we are going to test
	// that altering one uniform will not affect the other.
	DE_ASSERT(!(m_params.initSingle	&& m_params.useSameName &&
				!m_params.switchVtx && !m_params.switchFrg));

	if (m_params.initSingle)
	{
		string vtxSource = genVtxShaderSrc(initVtxSeed,
										   varyingCompatVtxOutputs(m_varyings),
										   vtxName, useUniform, pp.vtxScale);
		fullProg = createShaderProgram(&vtxSource, &frgSource, true);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT,
								   fullProg->getProgramName());
		log() << TestLog::Message
			  << "// Created pipeline " << pipeline->getPipeline()
			  << " with two-shader program " << fullProg->getProgramName()
			  << TestLog::EndMessage;
	}
	else
	{
		string vtxSource = genVtxShaderSrc(initVtxSeed, m_varyings.vtxOutputs,
										   vtxName, useUniform, pp.vtxScale);
		vtxProg = createSingleShaderProgram(glu::SHADERTYPE_VERTEX, vtxSource);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT, vtxProg->getProgramName());

		frgProg = createSingleShaderProgram(glu::SHADERTYPE_FRAGMENT, frgSource);
		pipeline->useProgramStages(GL_FRAGMENT_SHADER_BIT, frgProg->getProgramName());

		log() << TestLog::Message
			  << "// Created pipeline " << pipeline->getPipeline()
			  << " with vertex program " << vtxProg->getProgramName()
			  << " and fragment program " << frgProg->getProgramName()
			  << TestLog::EndMessage;
	}

	m_status.check(pipeline->isValid(),
				   "Pipeline is invalid after initialization");

	if (m_params.switchVtx)
	{
		string newSource = genVtxShaderSrc(pp.vtxSeed, m_varyings.vtxOutputs,
										   vtxName, useUniform, pp.vtxScale);
		vtxProg = createSingleShaderProgram(glu::SHADERTYPE_VERTEX, newSource);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT, vtxProg->getProgramName());
		log() << TestLog::Message
			  << "// Switched pipeline " << pipeline->getPipeline()
			  << "'s vertex stage to single-shader program " << vtxProg->getProgramName()
			  << TestLog::EndMessage;
	}
	if (m_params.switchFrg)
	{
		string newSource = genFrgShaderSrc(pp.frgSeed, m_varyings.frgInputs,
										   frgName, useUniform, pp.frgScale);
		frgProg = createSingleShaderProgram(glu::SHADERTYPE_FRAGMENT, newSource);
		pipeline->useProgramStages(GL_FRAGMENT_SHADER_BIT, frgProg->getProgramName());
		log() << TestLog::Message
			  << "// Switched pipeline " << pipeline->getPipeline()
			  << "'s fragment stage to single-shader program " << frgProg->getProgramName()
			  << TestLog::EndMessage;
	}

	if (m_params.switchVtx || m_params.switchFrg)
		m_status.check(pipeline->isValid(),
					   "Pipeline became invalid after changing a stage's program");

	if (m_params.useUniform)
	{
		ProgramWrapper& vtxStage = *(vtxProg ? vtxProg : fullProg);
		ProgramWrapper& frgStage = *(frgProg ? frgProg : fullProg);

		setUniform(vtxStage, vtxName, pp.vtxScale, m_params.useProgramUniform);
		setUniform(frgStage, frgName, pp.frgScale, m_params.useProgramUniform);
	}
	else
		log().writeMessage("// Programs use constants instead of uniforms");

	return MovePtr<Pipeline>(new Pipeline(pipeline, fullProg, vtxProg, frgProg));
}